

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O0

int frame_is_kf_gf_arf(AV1_COMP *cpi)

{
  char cVar1;
  int iVar2;
  long *in_RDI;
  FRAME_UPDATE_TYPE update_type;
  GF_GROUP *gf_group;
  bool local_12;
  
  cVar1 = *(char *)(*in_RDI + 400 + (ulong)*(byte *)(in_RDI + 0xe258));
  iVar2 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x77f0));
  local_12 = true;
  if ((iVar2 == 0) && (local_12 = true, cVar1 != '\x03')) {
    local_12 = cVar1 == '\x02';
  }
  return (int)local_12;
}

Assistant:

static inline int frame_is_kf_gf_arf(const AV1_COMP *cpi) {
  const GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  const FRAME_UPDATE_TYPE update_type =
      gf_group->update_type[cpi->gf_frame_index];

  return frame_is_intra_only(&cpi->common) || update_type == ARF_UPDATE ||
         update_type == GF_UPDATE;
}